

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

xmlChar * htmlFindEntityPrefix(xmlChar *string,size_t slen,int isAttr,int *nlen,int *rlen)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  ulong uVar4;
  long lVar5;
  bool local_92;
  bool local_8e;
  int isTerm;
  int isAlnum;
  int term;
  int cmp;
  size_t len;
  uint mid;
  xmlChar *bytes;
  size_t soff;
  size_t matchLen;
  uint local_48;
  int first;
  uint right;
  uint left;
  xmlChar *match;
  int *rlen_local;
  int *nlen_local;
  int isAttr_local;
  size_t slen_local;
  xmlChar *string_local;
  
  _right = (byte *)0x0;
  uVar2 = (uint)*string;
  soff = 0;
  bytes = (xmlChar *)0x1;
  if (slen < 2) {
    string_local = (xmlChar *)0x0;
  }
  else if (((uVar2 | 0x20) < 0x61) || (0x7a < (uVar2 | 0x20))) {
    string_local = (xmlChar *)0x0;
  }
  else {
    uVar2 = uVar2 & 0x3f;
    first = (int)CONCAT11(""[(int)(uVar2 * 3 + 1)],""[(int)(uVar2 * 3)]);
    uVar2 = first + (uint)""[(int)(uVar2 * 3 + 2)];
    while (local_48 = uVar2, (uint)first < local_48) {
      uVar2 = first + (local_48 - first >> 1);
      lVar5 = (long)(int)(uint)htmlEntValues[uVar2];
      pbVar3 = htmlEntStrings + lVar5;
      uVar4 = (ulong)(*pbVar3 & 0xffffff3f);
      isAlnum = (uint)string[(long)bytes] - (uint)htmlEntStrings[lVar5 + 1];
      if (isAlnum == 0) {
        if (slen < uVar4) {
          isAlnum = strncmp((char *)(string + (long)bytes + 1),(char *)(htmlEntStrings + lVar5 + 2),
                            slen - 1);
          if (isAlnum == 0) break;
        }
        else {
          isAlnum = strncmp((char *)(string + (long)bytes + 1),(char *)(htmlEntStrings + lVar5 + 2),
                            uVar4 - 1);
        }
      }
      if (-1 < isAlnum) {
        if (isAlnum < 1) {
          if (bytes + uVar4 < slen) {
            bVar1 = string[(long)(bytes + uVar4)];
          }
          else {
            bVar1 = 0;
          }
          if (((bVar1 | 0x20) < 0x61) || (local_8e = true, 0x7a < (bVar1 | 0x20))) {
            local_8e = 0x2f < bVar1 && bVar1 < 0x3a;
          }
          local_92 = true;
          if (((bVar1 != 0x3b) && (local_92 = false, (*pbVar3 & 0x80) != 0)) &&
             (local_92 = true, isAttr != 0)) {
            local_92 = !local_8e && bVar1 != 0x3d;
          }
          if (local_92) {
            _right = pbVar3 + uVar4 + 1;
            soff = (size_t)(bytes + uVar4);
            if (bVar1 == 0x3b) {
              soff = soff + 1;
            }
          }
          if ((*pbVar3 & 0x40) == 0) break;
          if (local_92) {
            _right = _right + 2;
          }
          if ((!local_8e) || (slen <= bytes + uVar4)) break;
          first = uVar2 + htmlEntStrings[uVar4 + lVar5 + 1];
          bytes = bytes + uVar4;
          uVar2 = first + (uint)htmlEntStrings[uVar4 + lVar5 + 2];
        }
        else {
          first = uVar2 + 1;
          uVar2 = local_48;
        }
      }
    }
    if (_right == (byte *)0x0) {
      string_local = (xmlChar *)0x0;
    }
    else {
      *nlen = (int)soff;
      *rlen = (uint)*_right;
      string_local = _right + 1;
    }
  }
  return string_local;
}

Assistant:

static const xmlChar *
htmlFindEntityPrefix(const xmlChar *string, size_t slen, int isAttr,
                     int *nlen, int *rlen) {
    const xmlChar *match = NULL;
    unsigned left, right;
    int first = string[0];
    size_t matchLen = 0;
    size_t soff = 1;

    if (slen < 2)
        return(NULL);
    if (!IS_ASCII_LETTER(first))
        return(NULL);

    /*
     * Look up range by first character
     */
    first &= 63;
    left = htmlEntAlpha[first*3] | htmlEntAlpha[first*3+1] << 8;
    right = left + htmlEntAlpha[first*3+2];

    /*
     * Binary search
     */
    while (left < right) {
        const xmlChar *bytes;
        unsigned mid;
        size_t len;
        int cmp;

        mid = left + (right - left) / 2;
        bytes = htmlEntStrings + htmlEntValues[mid];
        len = bytes[0] & ~ENT_F_ALL;

        cmp = string[soff] - bytes[1];

        if (cmp == 0) {
            if (slen < len) {
                cmp = strncmp((const char *) string + soff + 1,
                              (const char *) bytes + 2,
                              slen - 1);
                /* Prefix can never match */
                if (cmp == 0)
                    break;
            } else {
                cmp = strncmp((const char *) string + soff + 1,
                              (const char *) bytes + 2,
                              len - 1);
            }
        }

        if (cmp < 0) {
            right = mid;
        } else if (cmp > 0) {
            left = mid + 1;
        } else {
            int term = soff + len < slen ? string[soff + len] : 0;
            int isAlnum, isTerm;

            isAlnum = IS_ALNUM(term);
            isTerm = ((term == ';') ||
                      ((bytes[0] & ENT_F_SEMICOLON) &&
                       ((!isAttr) ||
                        ((!isAlnum) && (term != '=')))));

            if (isTerm) {
                match = bytes + len + 1;
                matchLen = soff + len;
                if (term == ';')
                    matchLen += 1;
            }

            if (bytes[0] & ENT_F_SUBTABLE) {
                if (isTerm)
                    match += 2;

                if ((isAlnum) && (soff + len < slen)) {
                    left = mid + bytes[len + 1];
                    right = left + bytes[len + 2];
                    soff += len;
                    continue;
                }
            }

            break;
        }
    }

    if (match == NULL)
        return(NULL);

    *nlen = matchLen;
    *rlen = match[0];
    return(match + 1);
}